

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

string * __thiscall
toml::detail::either::expected_chars_abi_cxx11_
          (string *__return_storage_ptr__,either *this,location *loc)

{
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *this_00;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  const_reference pvVar2;
  pointer psVar3;
  pointer psVar4;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->others_;
  pvVar2 = std::
           vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::at
                     (this_00,0);
  _Var1._M_head_impl =
       (pvVar2->scanner_)._M_t.
       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_scanner_base[4])(__return_storage_ptr__,_Var1._M_head_impl,loc);
  psVar4 = (this->others_).
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->others_).
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)psVar3 - (long)psVar4 == 0x10) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__," or ");
    pvVar2 = std::
             vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
             at(this_00,1);
    _Var1._M_head_impl =
         (pvVar2->scanner_)._M_t.
         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
         ._M_t.
         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_scanner_base[4])(&local_50,_Var1._M_head_impl,loc);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    __n = 1;
    while (__n < (ulong)((long)psVar3 - (long)psVar4 >> 3)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,", ");
      if (__n + 1 ==
          (long)(this->others_).
                super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->others_).
                super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"or ");
      }
      pvVar2 = std::
               vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               ::at(this_00,__n);
      _Var1._M_head_impl =
           (pvVar2->scanner_)._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_scanner_base[4])(&local_50,_Var1._M_head_impl,loc);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      psVar4 = (this->others_).
               super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __n = __n + 1;
      psVar3 = (this->others_).
               super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string either::expected_chars(location& loc) const
{
    assert( ! others_.empty());

    std::string expected = others_.at(0).expected_chars(loc);
    if(others_.size() == 2)
    {
        expected += " or ";
        expected += others_.at(1).expected_chars(loc);
    }
    else
    {
        for(std::size_t i=1; i<others_.size(); ++i)
        {
            expected += ", ";
            if(i + 1 == others_.size())
            {
                expected += "or ";
            }
            expected += others_.at(i).expected_chars(loc);
        }
    }
    return expected;
}